

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  Var v_00;
  bool bVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  int local_30;
  lbool local_2a;
  lbool local_29;
  int i;
  vec<unsigned_int> *cls;
  SimpSolver *pSStack_18;
  Var v_local;
  SimpSolver *this_local;
  
  cls._4_4_ = v;
  pSStack_18 = this;
  if ((this->use_simplification & 1U) == 0) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x1be,"bool Gluco::SimpSolver::asymmVar(Var)");
  }
  _i = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                 (&this->occurs,(int *)((long)&cls + 4));
  local_29 = Solver::value(&this->super_Solver,cls._4_4_);
  lbool::lbool(&local_2a,'\x02');
  bVar1 = lbool::operator!=(&local_29,local_2a);
  bVar4 = true;
  if (!bVar1) {
    iVar2 = vec<unsigned_int>::size(_i);
    bVar4 = iVar2 == 0;
  }
  if (bVar4) {
    this_local._7_1_ = true;
  }
  else {
    for (local_30 = 0; iVar2 = vec<unsigned_int>::size(_i), v_00 = cls._4_4_, local_30 < iVar2;
        local_30 = local_30 + 1) {
      puVar3 = vec<unsigned_int>::operator[](_i,local_30);
      bVar4 = asymm(this,v_00,*puVar3);
      if (!bVar4) {
        return false;
      }
    }
    this_local._7_1_ = backwardSubsumptionCheck(this,false);
  }
  return this_local._7_1_;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef>& cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0)
        return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i]))
            return false;

    return backwardSubsumptionCheck();
}